

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O3

char * __thiscall
icu_63::MaybeStackArray<char,_40>::orphanOrClone
          (MaybeStackArray<char,_40> *this,int32_t length,int32_t *resultCapacity)

{
  char *__dest;
  
  if (this->needToRelease == '\0') {
    if (0 < length) {
      if (this->capacity < length) {
        length = this->capacity;
      }
      __dest = (char *)uprv_malloc_63((long)length);
      if (__dest != (char *)0x0) {
        memcpy(__dest,this->ptr,(long)length);
        goto LAB_0021f48d;
      }
    }
    __dest = (char *)0x0;
  }
  else {
    __dest = this->ptr;
LAB_0021f48d:
    *resultCapacity = length;
    this->ptr = this->stackArray;
    this->capacity = 0x28;
    this->needToRelease = '\0';
  }
  return __dest;
}

Assistant:

inline T *MaybeStackArray<T, stackCapacity>::orphanOrClone(int32_t length, int32_t &resultCapacity) {
    T *p;
    if(needToRelease) {
        p=ptr;
    } else if(length<=0) {
        return NULL;
    } else {
        if(length>capacity) {
            length=capacity;
        }
        p=(T *)uprv_malloc(length*sizeof(T));
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStacArray (orphan) alloc %d * %lu\n", length,sizeof(T));
#endif
        if(p==NULL) {
            return NULL;
        }
        uprv_memcpy(p, ptr, (size_t)length*sizeof(T));
    }
    resultCapacity=length;
    resetToStackArray();
    return p;
}